

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::initGlobalLiveSpans(BaseRAPass *this)

{
  Error EVar1;
  byte *pbVar2;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> **ppRVar3;
  size_t physId;
  LiveRegSpans *liveSpans;
  size_t physCount;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *in_stack_ffffffffffffff28;
  ZoneVectorBase *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  ZoneVectorBase *local_a8;
  ulong local_a0;
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *local_98;
  ulong local_90;
  char local_84;
  char local_83;
  char local_82;
  undefined1 local_81;
  undefined1 *local_80;
  undefined1 *local_60;
  undefined1 local_51;
  undefined1 *local_50;
  undefined1 local_41;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  ZoneVectorBase **local_20;
  undefined8 local_18;
  ZoneVectorBase *local_10;
  ZoneVectorBase *local_8;
  
  local_80 = &local_81;
  local_51 = 0;
  local_82 = '\0';
  local_41 = 4;
  local_83 = '\x04';
  local_60 = local_80;
  local_50 = local_80;
  do {
    local_38 = &local_82;
    local_40 = &local_83;
    if (local_82 == local_83) {
      return 0;
    }
    local_30 = &local_82;
    local_84 = local_82;
    pbVar2 = RARegCount::operator[]
                       ((RARegCount *)CONCAT17(local_82,in_stack_ffffffffffffff38),
                        (RegGroup)((ulong)in_stack_ffffffffffffff30 >> 0x38));
    local_90 = (ulong)*pbVar2;
    local_98 = (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)0x0;
    if (local_90 != 0) {
      local_98 = ZoneAllocator::
                 allocT<asmjit::v1_14::RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>>
                           ((ZoneAllocator *)in_stack_ffffffffffffff30,
                            (size_t)in_stack_ffffffffffffff28);
      if (local_98 == (RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)0x0) {
        EVar1 = DebugUtils::errored(1);
        return EVar1;
      }
      for (local_a0 = 0; local_a0 < local_90; local_a0 = local_a0 + 1) {
        in_stack_ffffffffffffff30 = (ZoneVectorBase *)(local_98 + local_a0 * 0x10);
        local_18 = 0x10;
        local_20 = &local_a8;
        local_a8 = in_stack_ffffffffffffff30;
        if (in_stack_ffffffffffffff30 != (ZoneVectorBase *)0x0) {
          local_10 = in_stack_ffffffffffffff30;
          local_8 = in_stack_ffffffffffffff30;
          ZoneVectorBase::ZoneVectorBase(in_stack_ffffffffffffff30);
        }
      }
    }
    in_stack_ffffffffffffff28 = local_98;
    ppRVar3 = Support::
              Array<asmjit::v1_14::RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>_*,_4UL>
              ::operator[]<asmjit::v1_14::RegGroup>
                        ((Array<asmjit::v1_14::RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>_*,_4UL>
                          *)in_stack_ffffffffffffff30,(RegGroup *)local_98);
    *ppRVar3 = in_stack_ffffffffffffff28;
    local_28 = &local_82;
    local_82 = local_82 + '\x01';
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error BaseRAPass::initGlobalLiveSpans() noexcept {
  for (RegGroup group : RegGroupVirtValues{}) {
    size_t physCount = _physRegCount[group];
    LiveRegSpans* liveSpans = nullptr;

    if (physCount) {
      liveSpans = allocator()->allocT<LiveRegSpans>(physCount * sizeof(LiveRegSpans));
      if (ASMJIT_UNLIKELY(!liveSpans))
        return DebugUtils::errored(kErrorOutOfMemory);

      for (size_t physId = 0; physId < physCount; physId++)
        new(Support::PlacementNew{&liveSpans[physId]}) LiveRegSpans();
    }

    _globalLiveSpans[group] = liveSpans;
  }

  return kErrorOk;
}